

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

parser_error parse_ego_act(parser *p)

{
  parser_error pVar1;
  void *pvVar2;
  char *act_name;
  activation *paVar3;
  
  pvVar2 = parser_priv(p);
  act_name = parser_getstr(p,"name");
  if (pvVar2 == (void *)0x0) {
    pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    paVar3 = lookup_activation(act_name);
    *(activation **)((long)pvVar2 + 0x248) = paVar3;
    pVar1 = PARSE_ERROR_NONE;
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_ego_act(struct parser *p) {
	struct ego_item *e = parser_priv(p);
	const char *name = parser_getstr(p, "name");

	if (!e) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	e->activation = lookup_activation(name);
	return PARSE_ERROR_NONE;
}